

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O1

void __thiscall Lista<int>::Lista(Lista<int> *this,Lista<int> *l)

{
  Lista<int> nueva;
  Lista<int> local_28;
  
  this->_prim = (Nodo *)0x0;
  this->_ult = (Nodo *)0x0;
  local_28._prim = (Nodo *)0x0;
  local_28._ult = (Nodo *)0x0;
  operator=(&local_28,l);
  operator=(this,&local_28);
  eliminarTodos(&local_28);
  return;
}

Assistant:

Lista<T>::Lista(const Lista<T>& l) : Lista() {
    Lista nueva = Lista();
    nueva = l;
    *this = nueva;
}